

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O2

pair<int,_int> __thiscall
GameEngine::getDestinationPos(GameEngine *this,shared_ptr<Population> *tempPopulation)

{
  int32_t iVar1;
  uint uVar2;
  int32_t iVar3;
  int32_t iVar4;
  RandomGenerator *pRVar5;
  size_t sVar6;
  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_> *pvVar7;
  pair<int,_int> pVar8;
  int iVar9;
  bool bVar10;
  
  iVar1 = Population::GetXPos((tempPopulation->
                              super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  uVar2 = Population::GetYPos((tempPopulation->
                              super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  pRVar5 = RandomGenerator::getInstance();
  iVar9 = -1;
  iVar3 = RandomGenerator::randInt(pRVar5,-1,1);
  pRVar5 = RandomGenerator::getInstance();
  iVar4 = RandomGenerator::randInt(pRVar5,-1,1);
  sVar6 = Map::getHeight((this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if ((ulong)(long)(int)(uVar2 + 1) < sVar6) {
    iVar9 = 1;
    if (-1 < (int)(iVar4 + uVar2)) {
      iVar9 = iVar4;
    }
    if (iVar9 != 0) goto LAB_00135f77;
    iVar9 = 0;
  }
  else {
LAB_00135f77:
    pRVar5 = RandomGenerator::getInstance();
    bVar10 = (uVar2 & 0x80000001) != 1;
    if (bVar10) {
      iVar4 = -1;
    }
    else {
      iVar4 = 0;
    }
    iVar3 = RandomGenerator::randInt(pRVar5,iVar4,(uint)!bVar10);
  }
  if (iVar3 + iVar1 < 0) {
LAB_00135fc4:
    iVar3 = 0;
  }
  else {
    sVar6 = Map::getWidth((this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (sVar6 <= (uint)(iVar3 + iVar1)) goto LAB_00135fc4;
  }
  pvVar7 = Map::operator[]((this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           (long)(int)(uVar2 + iVar9));
  iVar4 = CellType::getCarnivoreCount
                    ((pvVar7->
                     super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[iVar1 + iVar3].
                     super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (iVar4 < 1) {
    pvVar7 = Map::operator[]((this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                             (long)(int)(uVar2 + iVar9));
    iVar1 = CellType::getHerbivoreCount
                      ((pvVar7->
                       super__Vector_base<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[iVar1 + iVar3].
                       super___shared_ptr<CellType,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (iVar1 < 1) goto LAB_00136012;
  }
  iVar3 = 0;
  iVar9 = 0;
LAB_00136012:
  pVar8.second = iVar9;
  pVar8.first = iVar3;
  return pVar8;
}

Assistant:

std::pair<int32_t, int32_t> GameEngine::getDestinationPos(std::shared_ptr<Population> tempPopulation) {
  int32_t xPos = tempPopulation->GetXPos();
  int32_t yPos = tempPopulation->GetYPos();
  int32_t dX = RandomGenerator::getInstance().randInt(-1, 1);
  int32_t dY = RandomGenerator::getInstance().randInt(-1, 1);
  if (yPos + dY < 0) {
    dY = 1;
  }
  if (yPos + 1 >= map->getHeight()) {
    dY = -1;
  }
  if (dY != 0) {
    if (yPos % 2 == 1) {
      dX = RandomGenerator::getInstance().randInt(0, 1);
    } else {
      dX = RandomGenerator::getInstance().randInt(-1, 0);
    }
  }
  if (xPos + dX < 0 || xPos + dX >= map->getWidth()) {
    dX = 0;
  }
  if ((*map)[yPos + dY][xPos + dX]->getCarnivoreCount() > 0 || (*map)[yPos + dY][xPos + dX]->getHerbivoreCount() > 0) {
    dX = 0;
    dY = 0;
  }
  return std::make_pair(dX, dY);
}